

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildtexture.cpp
# Opt level: O0

int __thiscall FTextureManager::CountBuildTiles(FTextureManager *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  BYTE *pBVar6;
  uchar *local_80;
  BYTE *art_1;
  BYTE *art;
  size_t len;
  FILE *local_60;
  FILE *f;
  FString artpath;
  int slashat;
  FString rffpath;
  int totaltiles;
  int numtiles;
  int lumpnum;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char artfile [13];
  int numartfiles;
  FTextureManager *this_local;
  
  artfile[5] = '\0';
  artfile[6] = '\0';
  artfile[7] = '\0';
  artfile[8] = '\0';
  numtiles._3_1_ = 't';
  lumpnum._0_1_ = 'i';
  lumpnum._1_1_ = 'l';
  lumpnum._2_1_ = 'e';
  lumpnum._3_1_ = 's';
  cStack_1c = 'X';
  cStack_1b = 'X';
  cStack_1a = 'X';
  builtin_strncpy(artfile,".art",5);
  rffpath.Chars._0_4_ = 0;
  unique0x100003bd = this;
  iVar2 = FWadCollection::CheckNumForFullName(&Wads,"blood.pal",false,0);
  if (-1 < iVar2) {
    iVar2 = FWadCollection::GetLumpFile(&Wads,iVar2);
    pcVar4 = FWadCollection::GetWadFullName(&Wads,iVar2);
    FString::FString((FString *)&stack0xffffffffffffffc8,pcVar4);
    lVar5 = FString::LastIndexOf((FString *)&stack0xffffffffffffffc8,'/');
    if ((int)lVar5 < 0) {
      FString::operator+=((FString *)&stack0xffffffffffffffc8,'/');
    }
    else {
      FString::Truncate((FString *)&stack0xffffffffffffffc8,(long)((int)lVar5 + 1));
    }
    for (; (int)artfile._5_4_ < 1000; artfile._5_4_ = artfile._5_4_ + 1) {
      cVar1 = SUB41(artfile._5_4_,3) >> 7;
      cStack_1c = ((char)(uint)((ulong)((long)(int)artfile._5_4_ * 0x51eb851f) >> 0x25) - cVar1) +
                  '0';
      iVar2 = (int)artfile._5_4_ / 10;
      cStack_1b = (char)iVar2 +
                  ((char)(uint)((ulong)((long)iVar2 * 0x66666667) >> 0x22) - (char)(iVar2 >> 0x1f))
                  * -10 + '0';
      cStack_1a = (char)artfile._5_4_ +
                  ((char)(uint)((ulong)((long)(int)artfile._5_4_ * 0x66666667) >> 0x22) - cVar1) *
                  -10 + '0';
      FString::FString((FString *)&f,(FString *)&stack0xffffffffffffffc8);
      FString::operator+=((FString *)&f,(char *)((long)&numtiles + 3));
      pcVar4 = FString::operator_cast_to_char_((FString *)&f);
      local_60 = fopen(pcVar4,"rb");
      if (local_60 == (FILE *)0x0) {
        len._4_4_ = 2;
      }
      else {
        iVar2 = Q_filelength((FILE *)local_60);
        art = (BYTE *)(long)iVar2;
        art_1 = (BYTE *)operator_new__((ulong)art);
        pBVar6 = (BYTE *)fread(art_1,1,(size_t)art,local_60);
        if ((pBVar6 == art) &&
           (rffpath.Chars._4_4_ = CountTiles(this,art_1), rffpath.Chars._4_4_ != 0)) {
          TArray<unsigned_char_*,_unsigned_char_*>::Push(&this->BuildTileFiles,&art_1);
          rffpath.Chars._0_4_ = rffpath.Chars._4_4_ + (int)rffpath.Chars;
        }
        else if (art_1 != (BYTE *)0x0) {
          operator_delete__(art_1);
        }
        fclose(local_60);
        len._4_4_ = 0;
      }
      FString::~FString((FString *)&f);
      if (len._4_4_ != 0) break;
    }
    FString::~FString((FString *)&stack0xffffffffffffffc8);
  }
  while( true ) {
    if (999 < (int)artfile._5_4_) {
      return (int)rffpath.Chars;
    }
    cStack_1c = (char)((int)artfile._5_4_ / 100) + '0';
    cStack_1b = (char)((long)((ulong)(uint)((int)((long)(int)artfile._5_4_ / 10) >> 0x1f) << 0x20 |
                             (long)(int)artfile._5_4_ / 10 & 0xffffffffU) % 10) + '0';
    cStack_1a = (char)((int)artfile._5_4_ % 10) + '0';
    iVar2 = FWadCollection::CheckNumForFullName(&Wads,(char *)((long)&numtiles + 3),false,0);
    if (iVar2 < 0) break;
    iVar3 = FWadCollection::LumpLength(&Wads,iVar2);
    local_80 = (uchar *)operator_new__((long)iVar3);
    FWadCollection::ReadLump(&Wads,iVar2,local_80);
    rffpath.Chars._4_4_ = CountTiles(this,local_80);
    if (rffpath.Chars._4_4_ == 0) {
      if (local_80 != (uchar *)0x0) {
        operator_delete__(local_80);
      }
    }
    else {
      TArray<unsigned_char_*,_unsigned_char_*>::Push(&this->BuildTileFiles,&local_80);
      rffpath.Chars._0_4_ = rffpath.Chars._4_4_ + (int)rffpath.Chars;
    }
    artfile._5_4_ = artfile._5_4_ + 1;
  }
  return (int)rffpath.Chars;
}

Assistant:

int FTextureManager::CountBuildTiles ()
{
	int numartfiles = 0;
	char artfile[] = "tilesXXX.art";
	int lumpnum;
	int numtiles;
	int totaltiles = 0;

	lumpnum = Wads.CheckNumForFullName ("blood.pal");
	if (lumpnum >= 0)
	{
		// Blood's tiles are external resources. (Why did they do it like that?)
		FString rffpath = Wads.GetWadFullName (Wads.GetLumpFile (lumpnum));
		int slashat = rffpath.LastIndexOf ('/');
		if (slashat >= 0)
		{
			rffpath.Truncate (slashat + 1);
		}
		else
		{
			rffpath += '/';
		}

		for (; numartfiles < 1000; numartfiles++)
		{
			artfile[5] = numartfiles / 100 + '0';
			artfile[6] = numartfiles / 10 % 10 + '0';
			artfile[7] = numartfiles % 10 + '0';

			FString artpath = rffpath;
			artpath += artfile;

			FILE *f = fopen (artpath, "rb");
			if (f == NULL)
			{
				break;
			}

			size_t len = Q_filelength (f);
			BYTE *art = new BYTE[len];
			if (fread (art, 1, len, f) != len || (numtiles = CountTiles(art)) == 0)
			{
				delete[] art;
			}
			else
			{
				BuildTileFiles.Push (art);
				totaltiles += numtiles;
			}
			fclose (f);
		}
	}

	for (; numartfiles < 1000; numartfiles++)
	{
		artfile[5] = numartfiles / 100 + '0';
		artfile[6] = numartfiles / 10 % 10 + '0';
		artfile[7] = numartfiles % 10 + '0';
		lumpnum = Wads.CheckNumForFullName (artfile);
		if (lumpnum < 0)
		{
			break;
		}

		BYTE *art = new BYTE[Wads.LumpLength (lumpnum)];
		Wads.ReadLump (lumpnum, art);

		if ((numtiles = CountTiles(art)) == 0)
		{
			delete[] art;
		}
		else
		{
			BuildTileFiles.Push (art);
			totaltiles += numtiles;
		}
	}
	return totaltiles;
}